

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::TypeMetaFunction::isResolved(TypeMetaFunction *this)

{
  bool bVar1;
  Expression *pEVar2;
  Type local_58;
  Type local_30;
  TypeMetaFunction *local_18;
  TypeMetaFunction *this_local;
  
  local_18 = this;
  pEVar2 = pool_ref<soul::AST::Expression>::get(&this->source);
  bVar1 = isResolvedAsValue(pEVar2);
  if (bVar1) {
    pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])();
    this_local._7_1_ = checkSourceType(this,&local_30);
    Type::~Type(&local_30);
  }
  else {
    pEVar2 = pool_ref<soul::AST::Expression>::get(&this->source);
    bVar1 = isResolvedAsType(pEVar2);
    if (bVar1) {
      pEVar2 = pool_ref<soul::AST::Expression>::operator->(&this->source);
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[5])();
      this_local._7_1_ = checkSourceType(this,&local_58);
      Type::~Type(&local_58);
    }
    else {
      pEVar2 = pool_ref<soul::AST::Expression>::get(&this->source);
      bVar1 = isResolvedAsEndpoint(pEVar2);
      if (bVar1) {
        this_local._7_1_ = this->operation == sourceType;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isResolved() const override
        {
            if (isResolvedAsValue (source.get()))      return checkSourceType (source->getResultType());
            if (isResolvedAsType (source.get()))       return checkSourceType (source->resolveAsType());
            if (isResolvedAsEndpoint (source.get()))   return operation == Op::sourceType;

            return false;
        }